

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::char_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
           *this,align_spec *spec,char_writer *f)

{
  iterator iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  vector<wchar_t,std::allocator<wchar_t>> *pvVar7;
  wchar_t __tmp;
  wchar_t local_40;
  wchar_t local_3c;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
  *local_38;
  
  uVar5 = (ulong)spec->width_;
  if (uVar5 < 2) {
    pvVar7 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
    iVar1._M_current = *(wchar_t **)(pvVar7 + 8);
    if (iVar1._M_current == *(wchar_t **)(pvVar7 + 0x10)) {
      std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                (pvVar7,iVar1,&f->value);
      return;
    }
    *iVar1._M_current = f->value;
    *(wchar_t **)(pvVar7 + 8) = iVar1._M_current + 1;
  }
  else {
    local_3c = spec->fill_;
    uVar6 = uVar5 - 1;
    local_40 = local_3c;
    if (spec->align_ == ALIGN_CENTER) {
      uVar2 = uVar6 >> 1;
      pvVar7 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
      uVar4 = uVar2;
      local_38 = this;
      if (spec->width_ != 2) {
        do {
          iVar1._M_current = *(wchar_t **)(pvVar7 + 8);
          if (iVar1._M_current == *(wchar_t **)(pvVar7 + 0x10)) {
            std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                      (pvVar7,iVar1,&local_40);
          }
          else {
            *iVar1._M_current = local_40;
            *(wchar_t **)(pvVar7 + 8) = iVar1._M_current + 1;
          }
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      this = local_38;
      *(vector<wchar_t,std::allocator<wchar_t>> **)local_38 = pvVar7;
      iVar1._M_current = *(wchar_t **)(pvVar7 + 8);
      if (iVar1._M_current == *(wchar_t **)(pvVar7 + 0x10)) {
        std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                  (pvVar7,iVar1,&f->value);
      }
      else {
        *iVar1._M_current = f->value;
        *(wchar_t **)(pvVar7 + 8) = iVar1._M_current + 1;
      }
      pvVar7 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
      local_40 = local_3c;
      if (uVar6 != uVar2) {
        lVar3 = (uVar2 - uVar5) + 1;
        do {
          iVar1._M_current = *(wchar_t **)(pvVar7 + 8);
          if (iVar1._M_current == *(wchar_t **)(pvVar7 + 0x10)) {
            std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                      (pvVar7,iVar1,&local_40);
          }
          else {
            *iVar1._M_current = local_40;
            *(wchar_t **)(pvVar7 + 8) = iVar1._M_current + 1;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0);
      }
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        pvVar7 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
        if (uVar6 != 0) {
          do {
            iVar1._M_current = *(wchar_t **)(pvVar7 + 8);
            if (iVar1._M_current == *(wchar_t **)(pvVar7 + 0x10)) {
              std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                        (pvVar7,iVar1,&local_40);
            }
            else {
              *iVar1._M_current = local_40;
              *(wchar_t **)(pvVar7 + 8) = iVar1._M_current + 1;
            }
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        *(vector<wchar_t,std::allocator<wchar_t>> **)this = pvVar7;
        iVar1._M_current = *(wchar_t **)(pvVar7 + 8);
        if (iVar1._M_current != *(wchar_t **)(pvVar7 + 0x10)) {
          *iVar1._M_current = f->value;
          *(wchar_t **)(pvVar7 + 8) = iVar1._M_current + 1;
          return;
        }
        std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                  (pvVar7,iVar1,&f->value);
        return;
      }
      pvVar7 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
      iVar1._M_current = *(wchar_t **)(pvVar7 + 8);
      if (iVar1._M_current == *(wchar_t **)(pvVar7 + 0x10)) {
        std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                  (pvVar7,iVar1,&f->value);
      }
      else {
        *iVar1._M_current = f->value;
        *(wchar_t **)(pvVar7 + 8) = iVar1._M_current + 1;
      }
      pvVar7 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
      if (uVar6 != 0) {
        do {
          iVar1._M_current = *(wchar_t **)(pvVar7 + 8);
          if (iVar1._M_current == *(wchar_t **)(pvVar7 + 0x10)) {
            std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                      (pvVar7,iVar1,&local_40);
          }
          else {
            *iVar1._M_current = local_40;
            *(wchar_t **)(pvVar7 + 8) = iVar1._M_current + 1;
          }
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
    }
    *(vector<wchar_t,std::allocator<wchar_t>> **)this = pvVar7;
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }